

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_130::checkEnumList<capnp::DynamicValue::Builder>
          (anon_unknown_130 *this,Builder *reader,initializer_list<const_char_*> expected)

{
  char *a;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  ulong uVar4;
  const_iterator ppcVar5;
  BuilderFor<capnp::DynamicEnum> BVar6;
  ArrayPtr<const_char> AVar7;
  DynamicEnum e;
  DynamicEnum e_00;
  Builder local_158;
  Schema local_118;
  uint local_110;
  ArrayPtr<const_char> local_108;
  bool local_f1;
  Schema SStack_f0;
  bool _kj_shouldLog;
  uint16_t local_e8;
  Builder local_e0;
  Schema local_a0;
  uint local_98;
  ArrayPtr<const_char> local_90;
  uint local_80;
  uint i;
  uint local_6c;
  size_type local_68;
  Fault local_60;
  Fault f;
  BuilderFor<capnp::DynamicList> list;
  Builder *reader_local;
  initializer_list<const_char_*> expected_local;
  
  expected_local._M_array = expected._M_array;
  reader_local = reader;
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)&f,(Builder *)this);
  sVar3 = std::initializer_list<const_char_*>::size((initializer_list<const_char_*> *)&reader_local)
  ;
  uVar2 = DynamicList::Builder::size((Builder *)&f);
  if (sVar3 != uVar2) {
    local_68 = std::initializer_list<const_char_*>::size
                         ((initializer_list<const_char_*> *)&reader_local);
    local_6c = DynamicList::Builder::size((Builder *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x14a,FAILED,"(expected.size()) == (list.size())","expected.size(), list.size()",
               &local_68,&local_6c);
    kj::_::Debug::Fault::fatal(&local_60);
  }
  local_80 = 0;
  while( true ) {
    uVar4 = (ulong)local_80;
    sVar3 = std::initializer_list<const_char_*>::size
                      ((initializer_list<const_char_*> *)&reader_local);
    if (sVar3 <= uVar4) break;
    ppcVar5 = std::initializer_list<const_char_*>::begin
                        ((initializer_list<const_char_*> *)&reader_local);
    a = ppcVar5[local_80];
    DynamicList::Builder::operator[](&local_e0,(Builder *)&f,local_80);
    BVar6 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_e0);
    e._8_8_ = BVar6._8_8_;
    SStack_f0.raw = (RawBrandedSchema *)BVar6.schema.super_Schema.raw;
    local_e8 = BVar6.value;
    local_98 = CONCAT22(local_98._2_2_,local_e8);
    e.schema.super_Schema.raw._4_4_ = 0;
    e.schema.super_Schema.raw._0_4_ = local_98;
    local_a0.raw = SStack_f0.raw;
    AVar7 = (ArrayPtr<const_char>)name((anon_unknown_130 *)SStack_f0.raw,e);
    local_90 = AVar7;
    bVar1 = kj::operator==(a,(StringPtr *)&local_90);
    DynamicValue::Builder::~Builder(&local_e0);
    if (!bVar1) {
      local_f1 = kj::_::Debug::shouldLog(ERROR);
      while (local_f1 != false) {
        ppcVar5 = std::initializer_list<const_char_*>::begin
                            ((initializer_list<const_char_*> *)&reader_local);
        uVar4 = (ulong)local_80;
        DynamicList::Builder::operator[](&local_158,(Builder *)&f,local_80);
        BVar6 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_158);
        e_00._8_8_ = BVar6._8_8_;
        local_118.raw = (RawBrandedSchema *)BVar6.schema.super_Schema.raw;
        local_110 = CONCAT22(local_110._2_2_,BVar6.value);
        e_00.schema.super_Schema.raw._4_4_ = 0;
        e_00.schema.super_Schema.raw._0_4_ = local_110;
        AVar7 = (ArrayPtr<const_char>)name((anon_unknown_130 *)local_118.raw,e_00);
        local_108 = AVar7;
        kj::_::Debug::log<char_const(&)[85],char_const*const&,capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x14c,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                   ,(char (*) [85])
                    "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                   ,ppcVar5 + uVar4,(Reader *)&local_108);
        DynamicValue::Builder::~Builder(&local_158);
        local_f1 = false;
      }
    }
    local_80 = local_80 + 1;
  }
  return;
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}